

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderRenderCase::render
          (ShaderRenderCase *this,Surface *result,int programID,QuadGrid *quadGrid)

{
  GLfloat GVar1;
  GLfloat GVar2;
  GLfloat GVar3;
  glClearColorFunc p_Var4;
  RenderContext *pRVar5;
  int iVar6;
  GLenum GVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar13;
  Vec4 *pVVar14;
  float *pfVar15;
  size_type sVar16;
  reference vertexArrays_00;
  deUint16 *indices;
  PixelBufferAccess local_c8;
  PrimitiveList local_a0;
  int local_84;
  undefined1 local_80 [4];
  int numElements;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  int yOffset;
  undefined1 local_54 [4];
  int xOffset;
  Random rnd;
  deUint32 hash;
  int yOffsetMax;
  int xOffsetMax;
  int height;
  int width;
  Functions *gl;
  QuadGrid *quadGrid_local;
  int programID_local;
  Surface *result_local;
  ShaderRenderCase *this_local;
  Functions *gl_00;
  
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
  GVar7 = (*gl_00->getError)();
  glu::checkError(GVar7,"pre render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x252);
  iVar6 = tcu::Surface::getWidth(result);
  iVar8 = tcu::Surface::getHeight(result);
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar9 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar9));
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar10 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar10));
  rnd.m_rnd.w = iVar10 - iVar8;
  pcVar13 = (char *)std::__cxx11::string::c_str();
  dVar11 = deStringHash(pcVar13);
  pcVar13 = (char *)std::__cxx11::string::c_str();
  dVar12 = deStringHash(pcVar13);
  rnd.m_rnd.z = dVar11 + dVar12;
  de::Random::Random((Random *)local_54,rnd.m_rnd.z);
  iVar9 = de::Random::getInt((Random *)local_54,0,iVar9 - iVar6);
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       de::Random::getInt((Random *)local_54,0,rnd.m_rnd.w);
  (*gl_00->viewport)(iVar9,(int)vertexArrays.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar6,iVar8);
  pVVar14 = QuadGrid::getConstCoords(quadGrid);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(this,(ulong)(uint)programID,pVVar14);
  setupDefaultInputs(this,programID);
  p_Var4 = gl_00->clearColor;
  pfVar15 = tcu::Vector<float,_4>::x(&this->m_clearColor);
  GVar1 = *pfVar15;
  pfVar15 = tcu::Vector<float,_4>::y(&this->m_clearColor);
  GVar2 = *pfVar15;
  pfVar15 = tcu::Vector<float,_4>::z(&this->m_clearColor);
  GVar3 = *pfVar15;
  pfVar15 = tcu::Vector<float,_4>::w(&this->m_clearColor);
  (*p_Var4)(GVar1,GVar2,GVar3,*pfVar15);
  (*gl_00->clear)(0x4000);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_80);
  local_84 = QuadGrid::getNumTriangles(quadGrid);
  local_84 = local_84 * 3;
  getDefaultVertexArrays
            (gl_00,quadGrid,programID,
             (vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_80);
  pRVar5 = this->m_renderCtx;
  sVar16 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                     ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                      local_80);
  vertexArrays_00 =
       std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::operator[]
                 ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                  local_80,0);
  iVar6 = local_84;
  indices = QuadGrid::getIndices(quadGrid);
  glu::pr::Triangles(&local_a0,iVar6,indices);
  glu::draw(pRVar5,programID,(int)sVar16,vertexArrays_00,&local_a0,(DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_80);
  GVar7 = (*gl_00->getError)();
  glu::checkError(GVar7,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x273);
  iVar6 = (int)vertexArrays.
               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pRVar5 = this->m_renderCtx;
  tcu::Surface::getAccess(&local_c8,result);
  glu::readPixels(pRVar5,iVar9,iVar6,&local_c8);
  GVar7 = (*gl_00->getError)();
  glu::checkError(GVar7,"post render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x278);
  de::Random::~Random((Random *)local_54);
  return;
}

Assistant:

void ShaderRenderCase::render (Surface& result, int programID, const QuadGrid& quadGrid)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "pre render");

	// Buffer info.
	int				width		= result.getWidth();
	int				height		= result.getHeight();

	int				xOffsetMax	= m_renderCtx.getRenderTarget().getWidth() - width;
	int				yOffsetMax	= m_renderCtx.getRenderTarget().getHeight() - height;

	deUint32		hash		= deStringHash(m_vertShaderSource.c_str()) + deStringHash(m_fragShaderSource.c_str());
	de::Random		rnd			(hash);

	int				xOffset		= rnd.getInt(0, xOffsetMax);
	int				yOffset		= rnd.getInt(0, yOffsetMax);

	gl.viewport(xOffset, yOffset, width, height);

	// Setup program.
	setupUniforms(programID, quadGrid.getConstCoords());
	setupDefaultInputs(programID);

	// Clear.
	gl.clearColor(m_clearColor.x(), m_clearColor.y(), m_clearColor.z(), m_clearColor.w());
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Draw.
	{
		std::vector<VertexArrayBinding>	vertexArrays;
		const int						numElements		= quadGrid.getNumTriangles()*3;

		getDefaultVertexArrays(gl, quadGrid, programID, vertexArrays);
		draw(m_renderCtx, programID, (int)vertexArrays.size(), &vertexArrays[0], pr::Triangles(numElements, quadGrid.getIndices()));
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	// Read back results.
	glu::readPixels(m_renderCtx, xOffset, yOffset, result.getAccess());

	GLU_EXPECT_NO_ERROR(gl.getError(), "post render");
}